

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

h264_macroblock * h264_mb_nb(h264_slice *slice,h264_mb_pos pos,int inter)

{
  h264_macroblock *phVar1;
  h264_macroblock *mbt;
  h264_macroblock *mbp;
  int inter_local;
  h264_mb_pos pos_local;
  h264_slice *slice_local;
  
  slice_local = (h264_slice *)h264_mb_nb_p(slice,pos,inter);
  phVar1 = slice->mbs + slice->curr_mb_addr;
  if (pos != H264_MB_THIS) {
    if (pos == H264_MB_A) {
      if ((((slice->mbaff_frame_flag != 0) && (((h264_macroblock *)slice_local)->mb_type != 0x39))
          && ((slice->curr_mb_addr & 1) != 0)) &&
         (((h264_macroblock *)slice_local)->mb_field_decoding_flag == phVar1->mb_field_decoding_flag
         )) {
        slice_local = (h264_slice *)((long)slice_local + 0x3774);
      }
    }
    else {
      if (pos != H264_MB_B) {
        abort();
      }
      if (slice->mbaff_frame_flag != 0) {
        if (phVar1->mb_field_decoding_flag == 0) {
          if ((slice->curr_mb_addr & 1) == 0) {
            if (((h264_macroblock *)slice_local)->mb_type != 0x39) {
              slice_local = (h264_slice *)((long)slice_local + 0x3774);
            }
          }
          else {
            slice_local = (h264_slice *)(phVar1 + -1);
          }
        }
        else if ((((h264_macroblock *)slice_local)->mb_type != 0x39) &&
                (((slice->curr_mb_addr & 1) != 0 ||
                 (((h264_macroblock *)slice_local)->mb_field_decoding_flag == 0)))) {
          slice_local = (h264_slice *)((long)slice_local + 0x3774);
        }
      }
    }
  }
  return (h264_macroblock *)slice_local;
}

Assistant:

const struct h264_macroblock *h264_mb_nb(struct h264_slice *slice, enum h264_mb_pos pos, int inter) {
	const struct h264_macroblock *mbp = h264_mb_nb_p(slice, pos, inter);
	const struct h264_macroblock *mbt = &slice->mbs[slice->curr_mb_addr];
	switch (pos) {
		case H264_MB_THIS:
			return mbp;
		case H264_MB_A:
			/* to the left */
			/* if not MBAFF - simply use mbp */
			/* if MBAFF and mbp not available - just pass mbp */
			/* if MBAFF and mbp available and frame/field coding differs - use mbp[0] */
			/* if MBAFF and mbp available and frame/field coding same - use mbp[curr_mb & 1] */
			if (slice->mbaff_frame_flag
					&& mbp->mb_type != H264_MB_TYPE_UNAVAIL
					&& (slice->curr_mb_addr & 1)
					&& mbp->mb_field_decoding_flag == mbt->mb_field_decoding_flag)
				return mbp + 1;
			return mbp;
		case H264_MB_B:
			if (slice->mbaff_frame_flag) {
				if (mbt->mb_field_decoding_flag) {
					/* MBAFF and in field mb */
					if (mbp->mb_type == H264_MB_TYPE_UNAVAIL)
						return mbp;
					/* MBAFF and in field mb, with mb pair above available */
					/* if above mb pair is frame coded, use bottom mb */
					/* if above is field coded, use mb of same parity */
					if (!(slice->curr_mb_addr & 1)
							&& mbp->mb_field_decoding_flag)
						return mbp;
					else
						return mbp+1;
				} else {
					/* MBAFF and in frame mb */
					/* if in bottom mb of the pair, use the top mb */
					if (slice->curr_mb_addr & 1)
						return mbt-1;
					/* otherwise, use the bottom mb of the above pair, whether field or frame */
					else if (mbp->mb_type != H264_MB_TYPE_UNAVAIL)
						return mbp+1;
					else
						return mbp;
				}
			}
			return mbp;
		default:
			abort();
	}
}